

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_parse.c
# Opt level: O1

void l2_absorb_stmt_var_def_list1(void)

{
  l2_token *plVar1;
  
  while( true ) {
    plVar1 = l2_token_stream_next_token(g_parser_p->token_stream_p);
    l2_token_stream_rollback(g_parser_p->token_stream_p);
    if (plVar1->type != L2_TOKEN_COMMA) {
      return;
    }
    l2_token_stream_next_token(g_parser_p->token_stream_p);
    plVar1 = l2_token_stream_next_token(g_parser_p->token_stream_p);
    l2_token_stream_rollback(g_parser_p->token_stream_p);
    if (plVar1->type != L2_TOKEN_IDENTIFIER) break;
    l2_token_stream_next_token(g_parser_p->token_stream_p);
    plVar1 = l2_token_stream_next_token(g_parser_p->token_stream_p);
    l2_token_stream_rollback(g_parser_p->token_stream_p);
    if (plVar1->type == L2_TOKEN_ASSIGN) {
      l2_token_stream_next_token(g_parser_p->token_stream_p);
      l2_absorb_expr_assign();
    }
  }
  l2_parse_token_forward();
  plVar1 = l2_parse_token_current();
  l2_parsing_error(L2_PARSING_ERROR_UNEXPECTED_TOKEN,plVar1->current_line,plVar1->current_col,plVar1
                  );
}

Assistant:

_if_type (L2_TOKEN_COMMA) /* , */
    {
        _if_type (L2_TOKEN_IDENTIFIER) /* id */
        {
            _if_type (L2_TOKEN_ASSIGN) /* = */
            {
                l2_absorb_expr_assign(); /* expr_assign */
            }
            _else /* without initialization */
            {

            }

            /* absorb last part of definition list in recursion */
            l2_absorb_stmt_var_def_list1();

        } _throw_unexpected_token

    } _end
}